

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

void __thiscall fineftp::FtpSession::handleFtpCommandOPTS(FtpSession *this,string *param)

{
  bool bVar1;
  allocator local_b9;
  string local_b8 [32];
  uint local_98;
  allocator local_91;
  string local_90 [32];
  char *local_70;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  string param_upper;
  string *param_local;
  FtpSession *this_local;
  
  ::std::__cxx11::string::string((string *)local_38,(string *)param);
  local_40 = ::std::__cxx11::string::begin();
  local_48 = ::std::__cxx11::string::end();
  local_50 = ::std::__cxx11::string::begin();
  local_70 = (char *)::std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,fineftp::FtpSession::handleFtpCommandOPTS(std::__cxx11::string_const&)::__0>
                               (local_40,local_48,local_50);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"UTF8 ON");
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_90,"OK",&local_91);
    sendFtpMessage(this,COMMAND_OK,(string *)local_90);
    ::std::__cxx11::string::~string(local_90);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b8,"Unrecognized parameter",&local_b9);
    sendFtpMessage(this,COMMAND_NOT_IMPLEMENTED_FOR_PARAMETER,(string *)local_b8);
    ::std::__cxx11::string::~string(local_b8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  }
  local_98 = (uint)bVar1;
  ::std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void FtpSession::handleFtpCommandOPTS(const std::string& param)
  {
    std::string param_upper = param;
    std::transform(param_upper.begin(), param_upper.end(), param_upper.begin(), [](char c) { return static_cast<char>(std::toupper(static_cast<unsigned char>(c))); });

    if (param_upper == "UTF8 ON")
    {
      sendFtpMessage(FtpReplyCode::COMMAND_OK, "OK");
      return;
    }

    sendFtpMessage(FtpReplyCode::COMMAND_NOT_IMPLEMENTED_FOR_PARAMETER, "Unrecognized parameter");
  }